

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void __thiscall kj::anon_unknown_9::DiskHandle::sync(DiskHandle *this)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_28;
  Fault f;
  SyscallResult local_14;
  DiskHandle *pDStack_10;
  SyscallResult _kjSyscallResult;
  DiskHandle *this_local;
  
  f.exception = (Exception *)this;
  pDStack_10 = this;
  local_14 = kj::_::Debug::syscall<kj::(anonymous_namespace)::DiskHandle::sync()const::_lambda()_1_>
                       ((anon_class_8_1_8991fb9c *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_14);
  if (pvVar1 != (void *)0x0) {
    return;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_14);
  kj::_::Debug::Fault::Fault
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x148,osErrorNumber,"fsync(fd)","");
  kj::_::Debug::Fault::fatal(&local_28);
}

Assistant:

void sync() const {
#if __APPLE__
    // For whatever reason, fsync() on OSX only flushes kernel buffers. It does not flush hardware
    // disk buffers. This makes it not very useful. But OSX documents fcntl F_FULLFSYNC which does
    // the right thing. Why they don't just make fsync() do the right thing, I do not know.
    KJ_SYSCALL(fcntl(fd, F_FULLFSYNC));
#else
    KJ_SYSCALL(fsync(fd));
#endif
  }